

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall interpreter::Interpreter::Run(Interpreter *this,string *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *out;
  VirtualMachine *local_68;
  shared_ptr<runtime::VirtualMachine> runtime;
  shared_ptr<ScriptAstNode> script;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_38 [8];
  shared_ptr<bytecode::CompiledFile> compiledFile;
  
  out = &runtime.super___shared_ptr<runtime::VirtualMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  parseScript((ostream *)out,*(string **)this);
  std::__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2> *)
             &script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2> *)out);
  compile((shared_ptr<ScriptAstNode> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  std::
  make_shared<runtime::VirtualMachine,bool,std::ostream&,std::istream&,std::shared_ptr<bytecode::CompiledFile>>
            ((bool *)&local_68,
             (basic_ostream<char,_std::char_traits<char>_> *)
             ((long)&compiledFile.
                     super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),*(basic_istream<char,_std::char_traits<char>_> **)this,
             *(shared_ptr<bytecode::CompiledFile> **)(this + 8));
  ::runtime::VirtualMachine::run(local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&runtime);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&compiledFile);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&script);
  return;
}

Assistant:

void interpreter::Interpreter::Run(const std::string & data) {

  std::shared_ptr<ScriptAstNode> script = parseScript(this->out, data);
  auto compiledFile = compile(script);
  auto runtime = std::make_shared<runtime::VirtualMachine>(false, this->out, this->in, std::move(compiledFile));
  runtime->run();
}